

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestRunnerSystemSemaphore::TestRunnerSystemSemaphore(TestRunnerSystemSemaphore *this)

{
  long in_FS_OFFSET;
  QArrayData *local_60;
  char16_t *local_58;
  undefined8 local_50;
  QNativeIpcKey local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->isAcquired)._M_base._M_i = false;
  local_60 = (QArrayData *)0x0;
  local_58 = L"androidtestrunner";
  local_50 = 0x11;
  QSystemSemaphore::platformSafeKey((QString *)&local_48,(Type)&local_60);
  QSystemSemaphore::QSystemSemaphore(&this->semaphore,&local_48,1,Open);
  QNativeIpcKey::~QNativeIpcKey(&local_48);
  if (local_60 != (QArrayData *)0x0) {
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TestRunnerSystemSemaphore() { }